

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

LoopInfo * __thiscall
Allocator::construct<LlvmCompilationContext::LoopInfo>(Allocator *this,int count)

{
  int iVar1;
  undefined4 extraout_var;
  LoopInfo *local_38;
  void *tmp;
  int count_local;
  Allocator *this_local;
  LoopInfo *pLVar2;
  
  iVar1 = (*this->_vptr_Allocator[2])(this,(ulong)(count * 0x10 + 4));
  pLVar2 = (LoopInfo *)CONCAT44(extraout_var,iVar1);
  if ((long)count != 0) {
    local_38 = pLVar2;
    do {
      LlvmCompilationContext::LoopInfo::LoopInfo(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != pLVar2 + count);
  }
  return pLVar2;
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}